

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicArray.hpp
# Opt level: O2

void __thiscall
stick::DynamicArray<stick::String>::reserve(DynamicArray<stick::String> *this,Size _s)

{
  Allocator *pAVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar4;
  Size extraout_RDX;
  String *this_00;
  String *_other;
  Size i_1;
  String *this_01;
  Size i;
  ulong uVar5;
  String *pSVar3;
  
  if ((this->m_data).size >> 5 < _s) {
    pAVar1 = this->m_allocator;
    if (pAVar1 == (Allocator *)0x0) {
      __assert_fail("m_allocator",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mokafolio[P]Stick/Stick/DynamicArray.hpp"
                    ,0x87,
                    "void stick::DynamicArray<stick::String>::reserve(Size) [T = stick::String]");
    }
    iVar2 = (*pAVar1->_vptr_Allocator[2])(pAVar1,_s << 5,8);
    pSVar3 = (String *)CONCAT44(extraout_var,iVar2);
    if (pSVar3 == (String *)0x0) {
      __assert_fail("blk",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mokafolio[P]Stick/Stick/DynamicArray.hpp"
                    ,0x89,
                    "void stick::DynamicArray<stick::String>::reserve(Size) [T = stick::String]");
    }
    this_00 = (String *)(this->m_data).ptr;
    _other = this_00;
    this_01 = pSVar3;
    for (uVar5 = 0; uVar4 = this->m_count, uVar5 < uVar4; uVar5 = uVar5 + 1) {
      String::String(this_01,_other);
      this_01 = this_01 + 1;
      _other = _other + 1;
    }
    for (uVar5 = 0; uVar5 < uVar4; uVar5 = uVar5 + 1) {
      String::deallocate(this_00);
      uVar4 = this->m_count;
      this_00 = this_00 + 1;
    }
    if ((this->m_data).ptr != (void *)0x0) {
      (*this->m_allocator->_vptr_Allocator[3])(this->m_allocator,this);
    }
    (this->m_data).ptr = pSVar3;
    (this->m_data).size = extraout_RDX;
  }
  return;
}

Assistant:

inline void reserve(Size _s)
    {
        auto c = capacity();
        if (_s > c)
        {
            STICK_ASSERT(m_allocator);
            auto blk = m_allocator->allocate(_s * sizeof(T), alignof(T));
            STICK_ASSERT(blk);
            T * arrayPtr = reinterpret_cast<T *>(blk.ptr);
            T * sourcePtr = reinterpret_cast<T *>(m_data.ptr);

            // move the existing elements over
            for (Size i = 0; i < m_count; ++i)
            {
                new (arrayPtr + i) T(std::move(sourcePtr[i]));
            }

            // call the destructors on the old elements
            for (Size i = 0; i < m_count; ++i)
            {
                sourcePtr[i].~T();
            }

            if (m_data)
                m_allocator->deallocate(m_data);

            m_data = blk;
        }
    }